

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

char * strrpl(char *str,size_t n,char oldchar,char newchar)

{
  bool bVar1;
  char *begin;
  char *rpl;
  size_t i;
  char c;
  char newchar_local;
  char oldchar_local;
  size_t n_local;
  char *str_local;
  
  str_local = (char *)calloc(n + 1,1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    rpl = (char *)0x0;
    begin = str_local;
    n_local = (size_t)str;
    while( true ) {
      bVar1 = false;
      if (rpl < n) {
        i._5_1_ = *(char *)n_local;
        bVar1 = i._5_1_ != '\0';
        n_local = n_local + 1;
      }
      if (!bVar1) break;
      if (i._5_1_ == oldchar) {
        i._5_1_ = newchar;
      }
      *begin = i._5_1_;
      rpl = rpl + 1;
      begin = begin + 1;
    }
  }
  return str_local;
}

Assistant:

static char *strrpl(const char *str, size_t n, char oldchar, char newchar) {
  char c;
  size_t i;
  char *rpl = (char *)calloc((1 + n), sizeof(char));
  char *begin = rpl;
  if (!rpl) {
    return NULL;
  }

  for (i = 0; (i < n) && (c = *str++); ++i) {
    if (c == oldchar) {
      c = newchar;
    }
    *rpl++ = c;
  }

  return begin;
}